

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall sznet::net::Buffer::shrink(Buffer *this,size_t reserve)

{
  pointer pcVar1;
  size_t sVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  undefined1 local_60 [8];
  Buffer other;
  
  Buffer((Buffer *)local_60,4,0x400);
  ensureWritableBytes((Buffer *)local_60,(reserve + this->m_writerIndex) - this->m_readerIndex);
  pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = this->m_readerIndex;
  pcVar6 = (pointer)(long)((int)this->m_writerIndex - (int)sVar2);
  ensureWritableBytes((Buffer *)local_60,(size_t)pcVar6);
  memcpy((void *)(other.m_nCheapPrepend + other.m_readerIndex),pcVar1 + sVar2,(size_t)pcVar6);
  if (pcVar6 <= other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + (-other.m_nCheapPrepend - other.m_readerIndex)) {
    pcVar6 = pcVar6 + other.m_readerIndex;
    pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar5 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)other.m_nCheapPrepend;
    (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pcVar3 = (pointer)this->m_readerIndex;
    this->m_readerIndex =
         (size_t)other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    other.m_readerIndex = this->m_writerIndex;
    this->m_writerIndex = (size_t)pcVar6;
    this->m_wrapSize =
         ((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage - other.m_nCheapPrepend) * 3 >> 2;
    if (pcVar1 != (pointer)0x0) {
      other.m_nCheapPrepend = (size_t)pcVar1;
      other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = pcVar4;
      other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = pcVar5;
      other.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = pcVar3;
      operator_delete(pcVar1);
    }
    return;
  }
  __assert_fail("len <= writableBytes()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0xd4,"void sznet::net::Buffer::hasWritten(size_t)");
}

Assistant:

void shrink(size_t reserve)
	{
		// FIXME: use vector::shrink_to_fit() in C++ 11 if possible.
		Buffer other;
		other.ensureWritableBytes(readableBytes() + reserve);
		other.append(toStringPiece());
		swap(other);
		m_wrapSize = m_buffer.capacity() * 3 / 4;
	}